

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimedTest.cpp
# Opt level: O2

void __thiscall oout::TimedTest::TimedTest(TimedTest *this,shared_ptr<const_oout::Test> *test)

{
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TimedTest_00129740;
  std::__shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->test).super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>,
             &test->super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

TimedTest::TimedTest(const shared_ptr<const Test> &test)
	: test(test)
{
}